

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O1

QTzTimeZoneCacheEntry *
QTzTimeZoneCache::findEntry(QTzTimeZoneCacheEntry *__return_storage_ptr__,QByteArray *ianaId)

{
  QList<QByteArray> *this;
  uint *puVar1;
  quint8 qVar2;
  byte bVar3;
  int iVar4;
  QString *this_00;
  Data *pDVar5;
  undefined8 uVar6;
  QTzTransition *pQVar7;
  Data *data;
  char *pcVar8;
  undefined1 auVar9 [8];
  int iVar10;
  bool bVar11;
  anon_struct_2_2_9f07e537 aVar12;
  int iVar13;
  Status SVar14;
  _Rb_tree_node_base *p_Var15;
  pointer pQVar16;
  storage_type *in_RCX;
  ulong uVar17;
  int extraout_EDX;
  int extraout_EDX_00;
  uint uVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  QList<int> *pQVar22;
  byte *pbVar23;
  ulong uVar24;
  QList<int> *unaff_R12;
  long lVar25;
  _Rb_tree_node_base *p_Var26;
  uint uVar27;
  qsizetype qVar28;
  undefined1 *puVar29;
  ulong uVar30;
  long in_FS_OFFSET;
  bool bVar31;
  QByteArrayView ba;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
  moved;
  QMap<int,_QByteArray> abbrevMap;
  bool ok;
  QTzHeader hdr2;
  QTzHeader hdr;
  QList<QTzTransition> local_158;
  undefined1 local_140 [16];
  QTzTransition *pQStack_130;
  undefined1 *local_128;
  QList<QTzTransition> local_118;
  QByteArray local_f8;
  bool local_d9;
  QFile local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [24];
  undefined1 *puStack_a0;
  undefined1 local_98 [8];
  QTzTransition *pQStack_90;
  undefined8 local_88;
  quint32 qStack_80;
  quint32 qStack_7c;
  quint32 qStack_78;
  undefined1 *puStack_74;
  undefined1 local_68 [16];
  undefined8 local_58;
  quint32 local_50;
  quint32 local_4c;
  quint32 qStack_48;
  undefined1 *puStack_44;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&__return_storage_ptr__->m_preZoneRule = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(__return_storage_ptr__->m_preZoneRule).abbreviationIndex = &DAT_aaaaaaaaaaaaaaaa
  ;
  (__return_storage_ptr__->m_posixRule).d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->m_posixRule).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->m_hasDst = false;
  (__return_storage_ptr__->m_tranTimes).d.d = (Data *)0x0;
  (__return_storage_ptr__->m_tranTimes).d.ptr = (QTzTransitionTime *)0x0;
  (__return_storage_ptr__->m_tranTimes).d.size = 0;
  (__return_storage_ptr__->m_tranRules).d.d = (Data *)0x0;
  (__return_storage_ptr__->m_tranRules).d.ptr = (QTzTransitionRule *)0x0;
  (__return_storage_ptr__->m_tranRules).d.size = 0;
  (__return_storage_ptr__->m_abbreviations).d.d = (Data *)0x0;
  (__return_storage_ptr__->m_abbreviations).d.ptr = (QByteArray *)0x0;
  (__return_storage_ptr__->m_abbreviations).d.size = 0;
  (__return_storage_ptr__->m_posixRule).d.d = (Data *)0x0;
  (__return_storage_ptr__->m_posixRule).d.ptr = (char *)0x0;
  (__return_storage_ptr__->m_posixRule).d.size = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->m_posixRule).d.size + 1) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->m_preZoneRule).stdOffset + 1) = 0;
  local_d8.super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d =
       (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile(&local_d8);
  this_00 = (QString *)(ianaId->d).size;
  if (this_00 == (QString *)0x0) {
    local_68._0_8_ = (QArrayData *)0x0;
    local_68._8_8_ = L"/etc/localtime";
    local_58 = (undefined1 *)0xe;
    QFile::setFileName(&local_d8,(QString *)local_68);
    iVar13 = extraout_EDX;
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
        iVar13 = extraout_EDX_00;
      }
    }
    iVar13 = QFile::open(&local_d8,(char *)0x1,iVar13);
    if ((char)iVar13 != '\0') goto LAB_0040835f;
  }
  else {
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)(ianaId->d).ptr;
    QString::fromLocal8Bit((QString *)local_68,this_00,ba);
    bVar11 = openZoneInfo((QString *)local_68,&local_d8);
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
    if (bVar11) {
LAB_0040835f:
      local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QDataStream::QDataStream((QDataStream *)local_b8,(QIODevice *)&local_d8);
      local_d9 = false;
      local_f8.d.d = (Data *)0x0;
      local_f8.d.ptr = (char *)0x0;
      local_f8.d.size = 0;
      qStack_48 = 0xaaaaaaaa;
      puStack_44 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_50 = 0xaaaaaaaa;
      local_4c = 0xaaaaaaaa;
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      parseTzHeader((QTzHeader *)local_68,(QDataStream *)local_b8,&local_d9);
      if ((local_d9 == true) &&
         (SVar14 = QDataStream::status((QDataStream *)local_b8), SVar14 == Ok)) {
        local_118.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_118.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_118.d.ptr = (QTzTransition *)&DAT_aaaaaaaaaaaaaaaa;
        parseTzTransitions(&local_118,(QDataStream *)local_b8,qStack_48,false);
        SVar14 = QDataStream::status((QDataStream *)local_b8);
        if (SVar14 == Ok) {
          local_128 = &DAT_aaaaaaaaaaaaaaaa;
          local_140._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pQStack_130 = (QTzTransition *)&DAT_aaaaaaaaaaaaaaaa;
          parseTzTypes((QList<QTzType> *)(local_140 + 8),(QDataStream *)local_b8,(quint32)puStack_44
                      );
          SVar14 = QDataStream::status((QDataStream *)local_b8);
          bVar11 = true;
          if (SVar14 == Ok) {
            local_140._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            parseTzAbbreviations
                      ((QDataStream *)local_140,(int)local_b8,
                       (QList<QTzType> *)((ulong)puStack_44 >> 0x20));
            SVar14 = QDataStream::status((QDataStream *)local_b8);
            bVar11 = true;
            if (SVar14 == Ok) {
              parseTzLeapSeconds((QDataStream *)local_b8,local_4c,false);
              SVar14 = QDataStream::status((QDataStream *)local_b8);
              if (SVar14 == Ok) {
                parseTzIndicators((QList<QTzType> *)local_98,(QDataStream *)local_b8,
                                  (QList<QTzType> *)(local_140 + 8),local_50,local_58._4_4_);
                local_128 = local_88;
                pQStack_130 = pQStack_90;
                auVar9 = local_98;
                uVar6 = local_140._8_8_;
                local_88 = (undefined1 *)0x0;
                local_98 = (undefined1  [8])0x0;
                pQStack_90 = (QTzTransition *)0x0;
                local_140._8_8_ = auVar9;
                if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                     *)uVar6 !=
                    (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                     *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)uVar6)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)uVar6)->_q_value).super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)uVar6)->_q_value).super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate((QArrayData *)uVar6,8,0x10);
                  }
                }
                if (local_98 != (undefined1  [8])0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i == 0)
                  {
                    QArrayData::deallocate((QArrayData *)local_98,8,0x10);
                  }
                }
                SVar14 = QDataStream::status((QDataStream *)local_b8);
                if (SVar14 == Ok) {
                  if ((local_68[4] & 0xfe) == 0x32) {
                    local_d9 = false;
                    qStack_78 = 0xaaaaaaaa;
                    puStack_74 = &DAT_aaaaaaaaaaaaaaaa;
                    local_88 = &DAT_aaaaaaaaaaaaaaaa;
                    qStack_80 = 0xaaaaaaaa;
                    qStack_7c = 0xaaaaaaaa;
                    local_98 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
                    pQStack_90 = (QTzTransition *)&DAT_aaaaaaaaaaaaaaaa;
                    parseTzHeader((QTzHeader *)local_98,(QDataStream *)local_b8,&local_d9);
                    bVar11 = true;
                    if ((local_d9 == true) &&
                       (SVar14 = QDataStream::status((QDataStream *)local_b8), SVar14 == Ok)) {
                      parseTzTransitions(&local_158,(QDataStream *)local_b8,qStack_78,true);
                      pDVar5 = local_118.d.d;
                      local_118.d.size = local_158.d.size;
                      local_118.d.ptr = local_158.d.ptr;
                      local_118.d.d = local_158.d.d;
                      local_158.d.size = 0;
                      local_158.d.d = (Data *)0x0;
                      local_158.d.ptr = (QTzTransition *)0x0;
                      if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                           *)pDVar5 !=
                          (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                           *)0x0) {
                        LOCK();
                        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                             + -1;
                        UNLOCK();
                        if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                            == 0) {
                          QArrayData::deallocate(&pDVar5->super_QArrayData,0x10,0x10);
                        }
                      }
                      if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                           *)local_158.d.d !=
                          (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                           *)0x0) {
                        LOCK();
                        ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i = ((local_158.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if (((local_158.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,0x10,0x10);
                        }
                      }
                      SVar14 = QDataStream::status((QDataStream *)local_b8);
                      if (SVar14 != Ok) goto LAB_004088f1;
                      parseTzTypes((QList<QTzType> *)&local_158,(QDataStream *)local_b8,
                                   (quint32)puStack_74);
                      uVar6 = local_140._8_8_;
                      local_128 = (undefined1 *)local_158.d.size;
                      pQStack_130 = local_158.d.ptr;
                      local_140._8_8_ = local_158.d.d;
                      local_158.d.size = 0;
                      local_158.d.d = (Data *)0x0;
                      local_158.d.ptr = (QTzTransition *)0x0;
                      if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                           *)uVar6 !=
                          (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                           *)0x0) {
                        LOCK();
                        (((QBasicAtomicInt *)uVar6)->_q_value).super___atomic_base<int>._M_i =
                             (((QBasicAtomicInt *)uVar6)->_q_value).super___atomic_base<int>._M_i +
                             -1;
                        UNLOCK();
                        if ((((QBasicAtomicInt *)uVar6)->_q_value).super___atomic_base<int>._M_i ==
                            0) {
                          QArrayData::deallocate((QArrayData *)uVar6,8,0x10);
                        }
                      }
                      if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                           *)local_158.d.d !=
                          (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                           *)0x0) {
                        LOCK();
                        ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i = ((local_158.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if (((local_158.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,8,0x10);
                        }
                      }
                      SVar14 = QDataStream::status((QDataStream *)local_b8);
                      if (SVar14 != Ok) goto LAB_004088f1;
                      parseTzAbbreviations
                                ((QDataStream *)local_c8,(int)local_b8,
                                 (QList<QTzType> *)((ulong)puStack_74 >> 0x20));
                      uVar6 = local_c8._0_8_;
                      local_158.d.d = (Data *)local_140._0_8_;
                      local_c8._0_8_ =
                           (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                            *)0x0;
                      local_140._0_8_ = uVar6;
                      QtPrivate::
                      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
                      ::~QExplicitlySharedDataPointerV2
                                ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
                                  *)&local_158);
                      QtPrivate::
                      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
                      ::~QExplicitlySharedDataPointerV2
                                ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
                                  *)local_c8);
                      SVar14 = QDataStream::status((QDataStream *)local_b8);
                      if (SVar14 != Ok) goto LAB_004088f1;
                      parseTzLeapSeconds((QDataStream *)local_b8,qStack_7c,true);
                      SVar14 = QDataStream::status((QDataStream *)local_b8);
                      if (SVar14 != Ok) goto LAB_004088f1;
                      parseTzIndicators((QList<QTzType> *)&local_158,(QDataStream *)local_b8,
                                        (QList<QTzType> *)(local_140 + 8),qStack_80,local_88._4_4_);
                      uVar6 = local_140._8_8_;
                      local_128 = (undefined1 *)local_158.d.size;
                      pQStack_130 = local_158.d.ptr;
                      local_140._8_8_ = local_158.d.d;
                      local_158.d.size = 0;
                      local_158.d.d = (Data *)0x0;
                      local_158.d.ptr = (QTzTransition *)0x0;
                      if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                           *)uVar6 !=
                          (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                           *)0x0) {
                        LOCK();
                        (((QBasicAtomicInt *)uVar6)->_q_value).super___atomic_base<int>._M_i =
                             (((QBasicAtomicInt *)uVar6)->_q_value).super___atomic_base<int>._M_i +
                             -1;
                        UNLOCK();
                        if ((((QBasicAtomicInt *)uVar6)->_q_value).super___atomic_base<int>._M_i ==
                            0) {
                          QArrayData::deallocate((QArrayData *)uVar6,8,0x10);
                        }
                      }
                      if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                           *)local_158.d.d !=
                          (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                           *)0x0) {
                        LOCK();
                        ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i = ((local_158.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if (((local_158.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,8,0x10);
                        }
                      }
                      SVar14 = QDataStream::status((QDataStream *)local_b8);
                      if (SVar14 != Ok) goto LAB_004088f1;
                      parseTzPosixRule((QByteArray *)&local_158,(QDataStream *)local_b8);
                      pcVar8 = local_f8.d.ptr;
                      data = local_f8.d.d;
                      qVar28 = local_158.d.size;
                      pDVar5 = local_158.d.d;
                      local_158.d.d = (Data *)local_f8.d.d;
                      local_f8.d.d = (Data *)pDVar5;
                      local_f8.d.ptr = (char *)local_158.d.ptr;
                      local_158.d.ptr = (QTzTransition *)pcVar8;
                      local_158.d.size = local_f8.d.size;
                      local_f8.d.size = qVar28;
                      if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                           *)data !=
                          (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                           *)0x0) {
                        LOCK();
                        (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                             (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                             -1;
                        UNLOCK();
                        if ((data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                            0) {
                          QArrayData::deallocate(&data->super_QArrayData,1,0x10);
                        }
                      }
                      SVar14 = QDataStream::status((QDataStream *)local_b8);
                      bVar31 = SVar14 == Ok;
                      bVar11 = !bVar31;
                    }
                    else {
LAB_004088f1:
                      bVar31 = false;
                    }
                    if (!bVar31) goto LAB_00408ce5;
                  }
                  else {
                    bVar11 = false;
                  }
                  if ((undefined1 *)local_f8.d.size != (undefined1 *)0x0) {
                    aVar12 = validatePosixRule(&local_f8,false);
                    bVar31 = true;
                    if (((ushort)aVar12 & 1) != 0) {
                      QByteArray::operator=(&__return_storage_ptr__->m_posixRule,&local_f8);
                      __return_storage_ptr__->m_hasDst = 0xff < (ushort)aVar12;
                      bVar31 = bVar11;
                    }
                    bVar11 = bVar31;
                    if (((ushort)aVar12 & 1) == 0) goto LAB_00408ce5;
                  }
                  if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                       *)local_140._0_8_ ==
                      (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                       *)0x0) {
                    qVar28 = 0;
                  }
                  else {
                    qVar28 = (qsizetype)
                             (((QArrayData *)(local_140._0_8_ + 0x30))->ref_)._q_value.
                             super___atomic_base<int>._M_i;
                  }
                  this = &__return_storage_ptr__->m_abbreviations;
                  QList<QByteArray>::clear(this);
                  QList<QByteArray>::reserve(this,qVar28);
                  local_98 = (undefined1  [8])0x0;
                  pQStack_90 = (QTzTransition *)0x0;
                  local_88 = (undefined1 *)0x0;
                  QList<int>::reserve((QList<int> *)local_98,qVar28);
                  if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                       *)local_140._0_8_ ==
                      (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                       *)0x0) {
                    p_Var15 = (_Rb_tree_node_base *)0x0;
                  }
                  else {
                    p_Var15 = *(_Rb_tree_node_base **)(local_140._0_8_ + 0x20);
                  }
                  p_Var26 = (_Rb_tree_node_base *)(local_140._0_8_ + 0x10);
                  if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                       *)local_140._0_8_ ==
                      (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                       *)0x0) {
                    p_Var26 = (_Rb_tree_node_base *)0x0;
                  }
                  if (p_Var15 != p_Var26) {
                    unaff_R12 = (QList<int> *)local_98;
                    do {
                      QList<QByteArray>::append(this,(parameter_type)&p_Var15[1]._M_parent);
                      QList<int>::append(unaff_R12,p_Var15[1]._M_color);
                      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
                    } while (p_Var15 != p_Var26);
                  }
                  if (local_128 != (undefined1 *)0x0) {
                    puVar29 = (undefined1 *)0x0;
                    do {
                      if (local_88 == (undefined1 *)0x0) {
LAB_00408a4e:
                        unaff_R12 = (QList<int> *)0xffffffffffffffff;
                      }
                      else {
                        pQVar22 = (QList<int> *)0xfffffffffffffffc;
                        do {
                          lVar25 = (long)local_88 * -4 + (long)pQVar22;
                          if (lVar25 == -4) goto LAB_00408a48;
                          unaff_R12 = (QList<int> *)((long)&(pQVar22->d).d + 4);
                          puVar1 = (uint *)((undefined1 *)((long)&pQStack_90->tz_time + 4) +
                                           (long)pQVar22);
                          pQVar22 = unaff_R12;
                        } while (*puVar1 !=
                                 (uint)*(byte *)((long)&pQStack_130->tz_time + (long)puVar29 * 8 + 5
                                                ));
                        unaff_R12 = (QList<int> *)((long)unaff_R12 >> 2);
LAB_00408a48:
                        if (lVar25 == -4) goto LAB_00408a4e;
                      }
                      pQVar16 = QList<QTzType>::data((QList<QTzType> *)(local_140 + 8));
                      pQVar16[(long)puVar29].tz_abbrind = (quint8)unaff_R12;
                      puVar29 = puVar29 + 1;
                    } while (puVar29 < local_128);
                    if (local_128 != (undefined1 *)0x0) {
                      qVar2 = *(quint8 *)((long)&pQStack_130->tz_time + 5);
                      (__return_storage_ptr__->m_preZoneRule).stdOffset = (int)pQStack_130->tz_time;
                      (__return_storage_ptr__->m_preZoneRule).dstOffset = 0;
                      (__return_storage_ptr__->m_preZoneRule).abbreviationIndex = qVar2;
                    }
                  }
                  iVar13 = (__return_storage_ptr__->m_preZoneRule).stdOffset;
                  if ((undefined1 *)local_118.d.size != (undefined1 *)0x0) {
                    lVar25 = 0;
                    do {
                      if (*(char *)((long)&pQStack_130->tz_time +
                                   (ulong)(&(local_118.d.ptr)->tz_typeind)[lVar25] * 8 + 4) == '\0')
                      {
                        iVar13 = (int)(&pQStack_130->tz_time)
                                      [(&(local_118.d.ptr)->tz_typeind)[lVar25]];
                        break;
                      }
                      bVar11 = local_118.d.size * 0x10 + -0x10 != lVar25;
                      lVar25 = lVar25 + 0x10;
                    } while (bVar11);
                  }
                  uVar27 = (uint)local_118.d.size;
                  QList<QTzTransitionTime>::reserve
                            (&__return_storage_ptr__->m_tranTimes,(long)(int)uVar27);
                  if (0 < (int)uVar27) {
                    iVar20 = 0xe10;
                    lVar25 = 0x18;
                    uVar30 = 0;
                    do {
                      pQVar7 = local_118.d.ptr;
                      local_158.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                      local_158.d.ptr = (QTzTransition *)&DAT_aaaaaaaaaaaaaaaa;
                      uVar17 = (ulong)local_118.d.ptr[uVar30].tz_typeind;
                      iVar4 = (int)(&pQStack_130->tz_time)[uVar17];
                      iVar10 = iVar4;
                      if (((*(byte *)((long)&pQStack_130->tz_time + uVar17 * 8 + 4) & 1) != 0) &&
                         (iVar10 = iVar13, iVar4 != iVar20 + iVar13)) {
                        pbVar23 = (byte *)((long)&(local_118.d.ptr)->tz_time + lVar25);
                        uVar24 = uVar30;
                        do {
                          uVar24 = uVar24 + 1;
                          if ((uVar27 & 0x7fffffff) <= uVar24) break;
                          bVar3 = *(byte *)((long)&pQStack_130->tz_time + (ulong)*pbVar23 * 8 + 4);
                          if (((bVar3 & 1) == 0) &&
                             (iVar10 = (int)(&pQStack_130->tz_time)[*pbVar23], iVar10 != iVar13)) {
                            uVar21 = iVar10 - (iVar4 - iVar20);
                            if (uVar21 != 0) {
                              if (iVar4 + -0xe10 == iVar13) goto LAB_00408bc7;
                              if (iVar4 + -0xe10 != iVar10) {
                                if (iVar10 < iVar4) {
                                  if (iVar4 <= iVar13) goto LAB_00408bbc;
                                }
                                else if (iVar13 < iVar4) goto LAB_00408bc7;
                                uVar18 = -uVar21;
                                if (0 < (int)uVar21) {
                                  uVar18 = uVar21;
                                }
                                uVar19 = iVar13 - (iVar4 - iVar20);
                                uVar21 = -uVar19;
                                if (0 < (int)uVar19) {
                                  uVar21 = uVar19;
                                }
                                if (uVar21 <= uVar18) goto LAB_00408bc7;
                              }
                            }
LAB_00408bbc:
                            iVar13 = iVar10;
                          }
LAB_00408bc7:
                          pbVar23 = pbVar23 + 0x10;
                        } while ((bVar3 & 1) != 0);
                        iVar20 = iVar4 - iVar13;
                        iVar10 = iVar13;
                      }
                      iVar13 = iVar10;
                      local_c8._4_4_ = iVar4 - iVar13;
                      local_c8._0_4_ = iVar13;
                      local_c8._9_3_ = 0xaaaaaa;
                      local_c8[8] = *(quint8 *)((long)&pQStack_130->tz_time + uVar17 * 8 + 5);
                      qVar28 = QtPrivate::indexOf<QTzTransitionRule,QTzTransitionRule>
                                         (&__return_storage_ptr__->m_tranRules,
                                          (QTzTransitionRule *)local_c8,0);
                      if ((int)qVar28 == -1) {
                        if (local_c8._4_4_ != 0) {
                          __return_storage_ptr__->m_hasDst = true;
                        }
                        local_158.d.ptr =
                             (QTzTransition *)
                             CONCAT71(local_158.d.ptr._1_7_,
                                      (char)(__return_storage_ptr__->m_tranRules).d.size);
                        QList<QTzTransitionRule>::append
                                  (&__return_storage_ptr__->m_tranRules,(parameter_type)local_c8);
                      }
                      else {
                        local_158.d.ptr =
                             (QTzTransition *)CONCAT71(local_158.d.ptr._1_7_,(char)qVar28);
                      }
                      local_158.d.d = (Data *)(pQVar7[uVar30].tz_time * 1000);
                      QList<QTzTransitionTime>::append
                                (&__return_storage_ptr__->m_tranTimes,(parameter_type)&local_158);
                      uVar30 = uVar30 + 1;
                      lVar25 = lVar25 + 0x10;
                    } while (uVar30 != (uVar27 & 0x7fffffff));
                  }
                  if (local_98 != (undefined1  [8])0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i +
                         -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i == 0
                       ) {
                      QArrayData::deallocate((QArrayData *)local_98,4,0x10);
                    }
                  }
                  bVar11 = true;
                }
              }
            }
LAB_00408ce5:
            QtPrivate::
            QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
            ::~QExplicitlySharedDataPointerV2
                      ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
                        *)local_140);
          }
          if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
               *)local_140._8_8_ !=
              (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
               *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_140._8_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_140._8_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_140._8_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_140._8_8_,8,0x10);
            }
          }
          if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
               *)local_118.d.d !=
              (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
               *)0x0) {
            LOCK();
            ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,0x10,0x10);
            }
          }
          if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
               *)local_f8.d.d !=
              (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
               *)0x0) {
            LOCK();
            ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,1,0x10);
            }
          }
          QDataStream::~QDataStream((QDataStream *)local_b8);
          QFile::~QFile(&local_d8);
          if (!bVar11) {
            QTzTimeZoneCacheEntry::~QTzTimeZoneCacheEntry(__return_storage_ptr__);
          }
          goto LAB_00408429;
        }
        if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
             *)local_118.d.d !=
            (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
             *)0x0) {
          LOCK();
          ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,0x10,0x10);
          }
        }
      }
      if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
           *)local_f8.d.d !=
          (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
           *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,1,0x10);
        }
      }
      QDataStream::~QDataStream((QDataStream *)local_b8);
    }
    else {
      aVar12 = validatePosixRule(ianaId,false);
      if (((ushort)aVar12 & 1) != 0) {
        __return_storage_ptr__->m_hasDst = 0xff < (ushort)aVar12;
        QByteArray::operator=(&__return_storage_ptr__->m_posixRule,ianaId);
      }
    }
  }
  QFile::~QFile(&local_d8);
LAB_00408429:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QTzTimeZoneCacheEntry QTzTimeZoneCache::findEntry(const QByteArray &ianaId)
{
    QTzTimeZoneCacheEntry ret;
    QFile tzif;
    if (ianaId.isEmpty()) {
        // Open system tz
        tzif.setFileName(QStringLiteral("/etc/localtime"));
        if (!tzif.open(QIODevice::ReadOnly))
            return ret;
    } else if (!openZoneInfo(QString::fromLocal8Bit(ianaId), &tzif)) {
        // ianaId may be a POSIX rule, taken from $TZ or /etc/TZ
        auto check = validatePosixRule(ianaId);
        if (check.isValid) {
            ret.m_hasDst = check.hasDst;
            ret.m_posixRule = ianaId;
        }
        return ret;
    }

    QDataStream ds(&tzif);

    // Parse the old version block of data
    bool ok = false;
    QByteArray posixRule;
    QTzHeader hdr = parseTzHeader(ds, &ok);
    if (!ok || ds.status() != QDataStream::Ok)
        return ret;
    QList<QTzTransition> tranList = parseTzTransitions(ds, hdr.tzh_timecnt, false);
    if (ds.status() != QDataStream::Ok)
        return ret;
    QList<QTzType> typeList = parseTzTypes(ds, hdr.tzh_typecnt);
    if (ds.status() != QDataStream::Ok)
        return ret;
    QMap<int, QByteArray> abbrevMap = parseTzAbbreviations(ds, hdr.tzh_charcnt, typeList);
    if (ds.status() != QDataStream::Ok)
        return ret;
    parseTzLeapSeconds(ds, hdr.tzh_leapcnt, false);
    if (ds.status() != QDataStream::Ok)
        return ret;
    typeList = parseTzIndicators(ds, typeList, hdr.tzh_ttisstdcnt, hdr.tzh_ttisgmtcnt);
    if (ds.status() != QDataStream::Ok)
        return ret;

    // If version 2 then parse the second block of data
    if (hdr.tzh_version == '2' || hdr.tzh_version == '3') {
        ok = false;
        QTzHeader hdr2 = parseTzHeader(ds, &ok);
        if (!ok || ds.status() != QDataStream::Ok)
            return ret;
        tranList = parseTzTransitions(ds, hdr2.tzh_timecnt, true);
        if (ds.status() != QDataStream::Ok)
            return ret;
        typeList = parseTzTypes(ds, hdr2.tzh_typecnt);
        if (ds.status() != QDataStream::Ok)
            return ret;
        abbrevMap = parseTzAbbreviations(ds, hdr2.tzh_charcnt, typeList);
        if (ds.status() != QDataStream::Ok)
            return ret;
        parseTzLeapSeconds(ds, hdr2.tzh_leapcnt, true);
        if (ds.status() != QDataStream::Ok)
            return ret;
        typeList = parseTzIndicators(ds, typeList, hdr2.tzh_ttisstdcnt, hdr2.tzh_ttisgmtcnt);
        if (ds.status() != QDataStream::Ok)
            return ret;
        posixRule = parseTzPosixRule(ds);
        if (ds.status() != QDataStream::Ok)
            return ret;
    }
    // Translate the TZ file's raw data into our internal form:

    if (!posixRule.isEmpty()) {
        auto check = validatePosixRule(posixRule);
        if (!check.isValid) // We got a POSIX rule, but it was malformed:
            return ret;
        ret.m_posixRule = posixRule;
        ret.m_hasDst = check.hasDst;
    }

    // Translate the array-index-based tz_abbrind into list index
    const int size = abbrevMap.size();
    ret.m_abbreviations.clear();
    ret.m_abbreviations.reserve(size);
    QList<int> abbrindList;
    abbrindList.reserve(size);
    for (auto it = abbrevMap.cbegin(), end = abbrevMap.cend(); it != end; ++it) {
        ret.m_abbreviations.append(it.value());
        abbrindList.append(it.key());
    }
    // Map tz_abbrind from map's keys (as initially read) to abbrindList's
    // indices (used hereafter):
    for (int i = 0; i < typeList.size(); ++i)
        typeList[i].tz_abbrind = abbrindList.indexOf(typeList.at(i).tz_abbrind);

    // TODO: is typeList[0] always the "before zones" data ? It seems to be ...
    if (typeList.size())
        ret.m_preZoneRule = { typeList.at(0).tz_gmtoff, 0, typeList.at(0).tz_abbrind };

    // Offsets are stored as total offset, want to know separate UTC and DST offsets
    // so find the first non-dst transition to use as base UTC Offset
    int utcOffset = ret.m_preZoneRule.stdOffset;
    for (const QTzTransition &tran : std::as_const(tranList)) {
        if (!typeList.at(tran.tz_typeind).tz_isdst) {
            utcOffset = typeList.at(tran.tz_typeind).tz_gmtoff;
            break;
        }
    }

    // Now for each transition time calculate and store our rule:
    const int tranCount = tranList.size();
    ret.m_tranTimes.reserve(tranCount);
    // The DST offset when in effect: usually stable, usually an hour:
    int lastDstOff = 3600;
    for (int i = 0; i < tranCount; i++) {
        const QTzTransition &tz_tran = tranList.at(i);
        QTzTransitionTime tran;
        QTzTransitionRule rule;
        const QTzType tz_type = typeList.at(tz_tran.tz_typeind);

        // Calculate the associated Rule
        if (!tz_type.tz_isdst) {
            utcOffset = tz_type.tz_gmtoff;
        } else if (Q_UNLIKELY(tz_type.tz_gmtoff != utcOffset + lastDstOff)) {
            /*
              This might be a genuine change in DST offset, but could also be
              DST starting at the same time as the standard offset changed.  See
              if DST's end gives a more plausible utcOffset (i.e. one closer to
              the last we saw, or a simple whole hour):
            */
            // Standard offset inferred from net offset and expected DST offset:
            const int inferStd = tz_type.tz_gmtoff - lastDstOff; // != utcOffset
            for (int j = i + 1; j < tranCount; j++) {
                const QTzType new_type = typeList.at(tranList.at(j).tz_typeind);
                if (!new_type.tz_isdst) {
                    const int newUtc = new_type.tz_gmtoff;
                    if (newUtc == utcOffset) {
                        // DST-end can't help us, avoid lots of messy checks.
                    // else: See if the end matches the familiar DST offset:
                    } else if (newUtc == inferStd) {
                        utcOffset = newUtc;
                    // else: let either end shift us to one hour as DST offset:
                    } else if (tz_type.tz_gmtoff - 3600 == utcOffset) {
                        // Start does it
                    } else if (tz_type.tz_gmtoff - 3600 == newUtc) {
                        utcOffset = newUtc; // End does it
                    // else: prefer whichever end gives DST offset closer to
                    // last, but consider any offset > 0 "closer" than any <= 0:
                    } else if (newUtc < tz_type.tz_gmtoff
                               ? (utcOffset >= tz_type.tz_gmtoff
                                  || qAbs(newUtc - inferStd) < qAbs(utcOffset - inferStd))
                               : (utcOffset >= tz_type.tz_gmtoff
                                  && qAbs(newUtc - inferStd) < qAbs(utcOffset - inferStd))) {
                        utcOffset = newUtc;
                    }
                    break;
                }
            }
            lastDstOff = tz_type.tz_gmtoff - utcOffset;
        }
        rule.stdOffset = utcOffset;
        rule.dstOffset = tz_type.tz_gmtoff - utcOffset;
        rule.abbreviationIndex = tz_type.tz_abbrind;

        // If the rule already exist then use that, otherwise add it
        int ruleIndex = ret.m_tranRules.indexOf(rule);
        if (ruleIndex == -1) {
            if (rule.dstOffset != 0)
                ret.m_hasDst = true;
            tran.ruleIndex = ret.m_tranRules.size();
            ret.m_tranRules.append(rule);
        } else {
            tran.ruleIndex = ruleIndex;
        }

        tran.atMSecsSinceEpoch = tz_tran.tz_time * 1000;
        ret.m_tranTimes.append(tran);
    }

    return ret;
}